

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

uint32_t helper_cls_h(target_ulong_conflict r1)

{
  uint32_t uVar1;
  uint32_t uVar2;
  undefined4 local_14;
  undefined4 local_10;
  uint32_t ret_hw1;
  uint32_t ret_hw0;
  target_ulong_conflict r1_local;
  
  uVar1 = extract32(r1,0,0x10);
  uVar2 = extract32(r1,0x10,0x10);
  local_10 = clrsb32(uVar1 << 0x10);
  local_14 = clrsb32(uVar2 << 0x10);
  if (0xf < local_10) {
    local_10 = 0xf;
  }
  if (0xf < local_14) {
    local_14 = 0xf;
  }
  return local_10 | local_14 << 0x10;
}

Assistant:

uint32_t helper_cls_h(target_ulong r1)
{
    uint32_t ret_hw0 = extract32(r1, 0, 16);
    uint32_t ret_hw1 = extract32(r1, 16, 16);

    ret_hw0 = clrsb32(ret_hw0 << 16);
    ret_hw1 = clrsb32(ret_hw1 << 16);

    if (ret_hw0 > 15) {
        ret_hw0 = 15;
    }
    if (ret_hw1 > 15) {
        ret_hw1 = 15;
    }

    return ret_hw0 | (ret_hw1 << 16);
}